

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindFileInFallbackDatabase(DescriptorPool *this,string *name)

{
  uint uVar1;
  Tables *pTVar2;
  size_type sVar3;
  FileDescriptor *pFVar4;
  undefined1 local_f8 [8];
  FileDescriptorProto file_proto;
  string *name_local;
  DescriptorPool *this_local;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    file_proto.source_code_info_ = (SourceCodeInfo *)name;
    pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                       (&this->tables_);
    sVar3 = std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&(pTVar2->known_bad_files_).
                     super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,(key_type *)file_proto.source_code_info_);
    if (sVar3 == 0) {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f8);
      uVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[2])
                        (this->fallback_database_,file_proto.source_code_info_,
                         (FileDescriptorProto *)local_f8);
      if (((uVar1 & 1) == 0) ||
         (pFVar4 = BuildFileFromDatabase(this,(FileDescriptorProto *)local_f8),
         pFVar4 == (FileDescriptor *)0x0)) {
        pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                           (&this->tables_);
        std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert(&(pTVar2->known_bad_files_).
                  super_unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ,(value_type *)file_proto.source_code_info_);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f8);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPool::TryFindFileInFallbackDatabase(const string& name) const {
  if (fallback_database_ == NULL) return false;

  if (tables_->known_bad_files_.count(name) > 0) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileByName(name, &file_proto) ||
      BuildFileFromDatabase(file_proto) == NULL) {
    tables_->known_bad_files_.insert(name);
    return false;
  }
  return true;
}